

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

void Style::addDataConstraints
               (Entry *entry,
               vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>
               *dataConstraints)

{
  bool bVar1;
  reference this;
  pointer ppVar2;
  Field *field;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
  local_60;
  iterator itr;
  u16string *fieldName;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *__range2;
  DataConstraint *constraint;
  iterator __end1;
  iterator __begin1;
  vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_> *__range1;
  vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_> *dataConstraints_local;
  Entry *entry_local;
  
  __end1 = std::vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>::begin
                     (dataConstraints);
  constraint = (DataConstraint *)
               std::vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>::end
                         (dataConstraints);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Style::DataConstraint_*,_std::vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>_>
                                     *)&constraint), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<Style::DataConstraint_*,_std::vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>_>
           ::operator*(&__end1);
    __end2 = std::
             unordered_set<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
             ::begin(&this->fields);
    fieldName = (u16string *)
                std::
                unordered_set<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                ::end(&this->fields);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_true>
                              ,(_Node_iterator_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_true>
                                *)&fieldName), bVar1) {
      itr.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                 )std::__detail::
                  _Node_const_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_true,_true>
                  ::operator*(&__end2);
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
           ::find(&entry->fields,
                  (key_type *)
                  itr.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                  ._M_cur);
      field = (Field *)std::
                       unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
                       ::end(&entry->fields);
      bVar1 = std::__detail::operator==
                        (&local_60,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                          *)&field);
      if (!bVar1) {
        ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_false,_true>
                               *)&local_60);
        (ppVar2->second).constraintType = this->type;
        (ppVar2->second).rangeMax = this->rangeMax;
        (ppVar2->second).rangeMin = this->rangeMin;
        std::__cxx11::string::operator=
                  ((string *)&(ppVar2->second).pattern,(string *)&this->pattern);
      }
      std::__detail::
      _Node_const_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_true,_true>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<Style::DataConstraint_*,_std::vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void addDataConstraints (Entry &entry, vector<DataConstraint> &dataConstraints) {
    for (const DataConstraint &constraint : dataConstraints) {
        for (const u16string &fieldName : constraint.fields) {
            auto itr = entry.fields.find(fieldName);
            if (itr == entry.fields.end()) continue;
            Field &field = itr->second;

            field.constraintType = constraint.type;
            field.rangeMax = constraint.rangeMax;
            field.rangeMin = constraint.rangeMin;
            field.pattern = constraint.pattern;
        }
    }
}